

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O3

Gia_Man_t * Gia_ManRemoveEnables2(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  undefined8 uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  Gia_Obj_t *pObj1;
  Gia_Obj_t *pObj0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar17 = p->pName;
  if (pcVar17 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar17);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar17);
  }
  p_00->pName = pcVar7;
  pcVar17 = p->pSpec;
  if (pcVar17 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar17);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar17);
  }
  p_00->pSpec = pcVar7;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar19 = 0;
    do {
      iVar5 = pVVar10->pArray[lVar19];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_0073057e;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar16 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar9 = p_00->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) {
LAB_0073059d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * -0x55555555);
      pGVar9 = p_00->pObjs;
      if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_0073059d;
      pGVar2[iVar5].Value = (int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * 0x55555556;
      lVar19 = lVar19 + 1;
      pVVar10 = p->vCis;
    } while (lVar19 < pVVar10->nSize);
  }
  iVar5 = p->nObjs;
  if (0 < iVar5) {
    lVar20 = 8;
    lVar19 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar16 = *(ulong *)((long)pGVar2 + lVar20 + -8);
      if ((uVar16 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar16) {
        uVar13 = *(uint *)((long)pGVar2 +
                          lVar20 + (ulong)(uint)((int)(uVar16 & 0x1fffffff) << 2) * -3);
        if (((int)uVar13 < 0) ||
           (uVar14 = *(uint *)((long)pGVar2 +
                              lVar20 + (ulong)((uint)(uVar16 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar14 < 0)) goto LAB_007305db;
        iVar5 = Gia_ManHashAnd(p_00,uVar13 ^ (uint)(uVar16 >> 0x1d) & 1,
                               uVar14 ^ (uint)(uVar16 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar20) = iVar5;
        iVar5 = p->nObjs;
      }
      lVar19 = lVar19 + 1;
      lVar20 = lVar20 + 0xc;
    } while (lVar19 < iVar5);
  }
  iVar15 = p->nRegs;
  pVVar10 = p->vCos;
  uVar13 = pVVar10->nSize;
  if (uVar13 - iVar15 != 0 && iVar15 <= (int)uVar13) {
    uVar16 = 0;
    uVar18 = 0;
    if (0 < (int)uVar13) {
      uVar18 = (ulong)uVar13;
    }
    do {
      if (uVar18 == uVar16) goto LAB_007305bc;
      iVar1 = pVVar10->pArray[uVar16];
      if (((long)iVar1 < 0) || (iVar5 <= iVar1)) goto LAB_0073057e;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar1;
      if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0)
      goto LAB_007305db;
      pGVar2->Value =
           (uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
           pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value;
      uVar16 = uVar16 + 1;
    } while (uVar13 - iVar15 != uVar16);
  }
  if (0 < iVar15) {
    uVar14 = 0;
    do {
      pVVar10 = p->vCos;
      uVar13 = pVVar10->nSize;
      uVar12 = (uVar13 - iVar15) + uVar14;
      if (((int)uVar12 < 0) || ((int)uVar13 <= (int)uVar12)) {
LAB_007305bc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = pVVar10->pArray[uVar12];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_0073057e;
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_00730502;
      pGVar2 = p->pObjs + iVar5;
      uVar3 = *(undefined8 *)pGVar2;
      iVar5 = Gia_ObjIsMuxType(pGVar2 + -(ulong)((uint)uVar3 & 0x1fffffff));
      if (iVar5 == 0) {
        pcVar17 = "Cannot recognize enable of flop %d.\n";
LAB_007304c8:
        printf(pcVar17,(ulong)uVar14);
      }
      else {
        pGVar9 = Gia_ObjRecognizeMux(pGVar2 + -(ulong)((uint)uVar3 & 0x1fffffff),&local_40,&local_38
                                    );
        uVar13 = (uint)*(undefined8 *)pGVar2;
        if ((-1 < (int)uVar13) || ((uVar13 & 0x1fffffff) == 0x1fffffff)) {
LAB_007305fa:
          __assert_fail("Gia_ObjIsRi(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1fe,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar12 = (uint)((ulong)*(undefined8 *)pGVar2 >> 0x20) & 0x1fffffff;
        iVar5 = p->vCos->nSize;
        if ((int)uVar12 < iVar5 - p->nRegs) goto LAB_007305fa;
        iVar15 = p->vCis->nSize;
        uVar12 = (iVar15 - iVar5) + uVar12;
        if (((int)uVar12 < 0) || (iVar15 <= (int)uVar12)) goto LAB_007305bc;
        iVar5 = p->vCis->pArray[uVar12];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_0073057e;
        pGVar8 = p->pObjs + iVar5;
        if ((pGVar8 != (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe)) &&
           (pGVar8 != (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe))) {
          pcVar17 = "Cannot recognize self-loop of enable flop %d.\n";
          goto LAB_007304c8;
        }
        if ((uVar13 >> 0x1d & 1) == 0) {
          local_38 = (Gia_Obj_t *)((ulong)local_38 ^ 1);
          local_40 = (Gia_Obj_t *)((ulong)local_40 ^ 1);
        }
        pGVar4 = local_38;
        if (((ulong)pGVar9 & 1) != 0) {
          local_38 = local_40;
          local_40 = pGVar4;
        }
        if (pGVar8 == (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe)) {
          uVar13 = ((Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe))->Value;
          if ((int)uVar13 < 0) {
LAB_007305db:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pGVar2->Value = uVar13 ^ (uint)local_40 & 1 ^ 1;
        }
        else if (pGVar8 == (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe)) {
          uVar13 = ((Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe))->Value;
          if ((int)uVar13 < 0) goto LAB_007305db;
          pGVar2->Value = (uint)local_38 & 1 ^ uVar13 ^ 1;
        }
      }
      uVar14 = uVar14 + 1;
      iVar15 = p->nRegs;
    } while ((int)uVar14 < iVar15);
    pVVar10 = p->vCos;
    uVar13 = pVVar10->nSize;
  }
LAB_00730502:
  if (0 < (int)uVar13) {
    lVar19 = 0;
    do {
      iVar5 = pVVar10->pArray[lVar19];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_0073057e:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManAppendCo(p_00,p->pObjs[iVar5].Value);
      lVar19 = lVar19 + 1;
      pVVar10 = p->vCos;
    } while (lVar19 < pVVar10->nSize);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_ManRemoveEnables2( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pAux; 
    Gia_Obj_t * pTemp, * pObjC, * pObj0, * pObj1, * pFlopIn, * pFlopOut;
    Gia_Obj_t * pThis, * pNode;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pThis, i )
        pThis->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pThis, i )
        pThis->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pThis), Gia_ObjFanin1Copy(pThis) );
    Gia_ManForEachPo( p, pThis, i )
        pThis->Value = Gia_ObjFanin0Copy(pThis);
    Gia_ManForEachRi( p, pFlopIn, i )
    {
        pNode = Gia_ObjFanin0(pFlopIn);
        if ( !Gia_ObjIsMuxType(pNode) )
        {
            printf( "Cannot recognize enable of flop %d.\n", i );
            continue;
        }
        pObjC = Gia_ObjRecognizeMux( pNode, &pObj1, &pObj0 );
        pFlopOut = Gia_ObjRiToRo( p, pFlopIn );
        if ( Gia_Regular(pObj0) != pFlopOut && Gia_Regular(pObj1) != pFlopOut )
        {
            printf( "Cannot recognize self-loop of enable flop %d.\n", i );
            continue;
        }
        if ( !Gia_ObjFaninC0(pFlopIn) )
        {
            pObj0 = Gia_Not(pObj0);
            pObj1 = Gia_Not(pObj1);
        }
        if ( Gia_IsComplement(pObjC) )
        {
            pObjC = Gia_Not(pObjC);
            pTemp = pObj0;
            pObj0 = pObj1;
            pObj1 = pTemp;
        }
        if ( Gia_Regular(pObj0) == pFlopOut )
        {
//            printf( "FlopIn compl = %d. FlopOut is d0. Complement = %d.\n", 
//                Gia_ObjFaninC0(pFlopIn), Gia_IsComplement(pObj0) );
            pFlopIn->Value = Abc_LitNotCond(Gia_Regular(pObj1)->Value, !Gia_IsComplement(pObj1));
        }
        else if ( Gia_Regular(pObj1) == pFlopOut )
        {
//            printf( "FlopIn compl = %d. FlopOut is d1. Complement = %d.\n", 
//                Gia_ObjFaninC0(pFlopIn), Gia_IsComplement(pObj1) );
            pFlopIn->Value = Abc_LitNotCond(Gia_Regular(pObj0)->Value, !Gia_IsComplement(pObj0));
        }
    }
    Gia_ManForEachCo( p, pThis, i )
        Gia_ManAppendCo( pNew, pThis->Value );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pAux = pNew );
    Gia_ManStop( pAux );
    return pNew;
}